

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_ParseJSON2(JSContext *ctx,char *buf,size_t buf_len,char *filename,int flags)

{
  int iVar1;
  JSValue v;
  JSParseState s1;
  
  s1.token.ptr = (uint8_t *)0x0;
  s1.cur_func = (JSFunctionDef *)0x0;
  s1.is_module = 0;
  s1.allow_html_comments = 0;
  s1.got_lf = 0;
  s1._76_4_ = 0;
  s1.last_ptr = (uint8_t *)0x0;
  s1.token.u.regexp.flags.u = (JSValueUnion)0x0;
  s1.token.u.regexp.flags.tag = 0;
  s1.token.u.str.str.u = (JSValueUnion)0x0;
  s1.token.u.str.str.tag = 0;
  s1.last_line_num = 0;
  s1.line_num = 1;
  s1.buf_end = (uint8_t *)(buf + buf_len);
  s1.token.val = 0x20;
  s1.token.line_num = 1;
  s1._120_8_ = (ulong)(uint)flags & 0xffffffff00000001;
  s1.ctx = ctx;
  s1.filename = filename;
  s1.buf_ptr = (uint8_t *)buf;
  iVar1 = json_next_token(&s1);
  if (iVar1 == 0) {
    v = json_parse_value(&s1);
    if ((int)v.tag != 6) {
      if (s1.token.val == -0x56) {
        return v;
      }
      js_parse_error(&s1,"unexpected data at the end");
    }
  }
  else {
    v = (JSValue)(ZEXT816(3) << 0x40);
  }
  JS_FreeValue(ctx,v);
  free_token(&s1,&s1.token);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

JSValue JS_ParseJSON2(JSContext *ctx, const char *buf, size_t buf_len,
                      const char *filename, int flags)
{
    JSParseState s1, *s = &s1;
    JSValue val = JS_UNDEFINED;

    js_parse_init(ctx, s, buf, buf_len, filename);
    s->ext_json = ((flags & JS_PARSE_JSON_EXT) != 0);
    if (json_next_token(s))
        goto fail;
    val = json_parse_value(s);
    if (JS_IsException(val))
        goto fail;
    if (s->token.val != TOK_EOF) {
        if (js_parse_error(s, "unexpected data at the end"))
            goto fail;
    }
    return val;
 fail:
    JS_FreeValue(ctx, val);
    free_token(s, &s->token);
    return JS_EXCEPTION;
}